

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::GetSetParameterTest::iterate(GetSetParameterTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ContextType ctxType;
  deUint32 dVar7;
  undefined4 extraout_var;
  char *description;
  byte bVar9;
  qpTestResult testResult;
  TestContext *this_00;
  GLuint texture;
  GLint value_dst;
  GLfloat value_dst_2 [4];
  undefined8 local_98;
  undefined8 uStack_90;
  byte local_82;
  byte local_81;
  byte local_80;
  byte local_7f;
  byte local_7e;
  byte local_7d;
  byte local_7c;
  byte local_7b;
  byte local_7a;
  byte local_79;
  byte local_78;
  byte local_77;
  byte local_76;
  byte local_75;
  byte local_74;
  byte local_73;
  byte local_72;
  byte local_71;
  byte local_70;
  byte local_6f;
  byte local_6e;
  byte local_6d;
  byte local_6c;
  byte local_6b;
  byte local_6a;
  byte local_69;
  byte local_68;
  byte local_67;
  byte local_66;
  byte local_65;
  byte local_64;
  byte local_63;
  byte local_62;
  byte local_61;
  byte local_60;
  byte local_5f;
  byte local_5e;
  byte local_5d;
  byte local_5c;
  byte local_5b;
  byte local_5a;
  byte local_59;
  byte local_58;
  byte local_57;
  byte local_56;
  byte local_55;
  byte local_54;
  byte local_53;
  byte local_52;
  byte local_51;
  byte local_50;
  byte local_4f;
  byte local_4e;
  byte local_4d;
  byte local_4c;
  byte local_4b;
  byte local_4a;
  byte local_49;
  GLfloat local_48 [6];
  long lVar8;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    (**(code **)(lVar8 + 0x6f8))(1);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1654);
    (**(code **)(lVar8 + 0xb8))(0x806f,0);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glBindTexture has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1657);
    local_98._0_4_ = 0.0;
    (**(code **)(lVar8 + 0x1428))(0,0x90ea,0x1902);
    bVar1 = CheckErrorAndLog(this,"glTextureParameteri",0x90ea);
    (**(code **)(lVar8 + 0xb08))(0,0x90ea,&local_98);
    bVar2 = CheckErrorAndLog(this,"glGetTextureParameteriv",0x90ea);
    bVar3 = CompareAndLog(this,0x1902,(GLint)(GLfloat)local_98,0x90ea);
    local_98 = (ulong)local_98._4_4_ << 0x20;
    (**(code **)(lVar8 + 0x1428))(0,0x813c,2);
    bVar4 = CheckErrorAndLog(this,"glTextureParameteri",0x813c);
    (**(code **)(lVar8 + 0xb08))(0,0x813c,&local_98);
    local_49 = CheckErrorAndLog(this,"glGetTextureParameteriv",0x813c);
    local_4a = CompareAndLog(this,2,(GLint)(GLfloat)local_98,0x813c);
    local_98 = 0x3f0000003e800000;
    uStack_90 = 0x3f8000003f400000;
    local_48[0] = 0.0;
    local_48[1] = 0.0;
    local_48[2] = 0.0;
    local_48[3] = 0.0;
    (**(code **)(lVar8 + 0x1420))(0,0x1004);
    local_4b = CheckErrorAndLog(this,"glTextureParameterfv",0x1004);
    (**(code **)(lVar8 + 0xb00))(0,0x1004,local_48);
    local_4c = CheckErrorAndLog(this,"glGetTextureParameterfv",0x1004);
    local_4d = CompareAndLog(this,(GLfloat *)&local_98,local_48,0x1004);
    local_98 = 0x4000000000;
    uStack_90 = 0xffffffe0ffffffc0;
    local_48[0] = 0.0;
    local_48[1] = 0.0;
    local_48[2] = 0.0;
    local_48[3] = 0.0;
    (**(code **)(lVar8 + 0x1408))(0,0x1004);
    local_4e = CheckErrorAndLog(this,"glTextureParameterIiv",0x1004);
    (**(code **)(lVar8 + 0xaf0))(0,0x1004,local_48);
    local_4f = CheckErrorAndLog(this,"glGetTextureParameterIiv",0x1004);
    local_50 = CompareAndLog(this,(GLint *)&local_98,(GLint *)local_48,0x1004);
    local_98 = 0x4000000000;
    uStack_90 = 0xc000000080;
    local_48[0] = 0.0;
    local_48[1] = 0.0;
    local_48[2] = 0.0;
    local_48[3] = 0.0;
    (**(code **)(lVar8 + 0x1410))(0,0x1004);
    local_51 = CheckErrorAndLog(this,"glTextureParameterIuiv",0x1004);
    (**(code **)(lVar8 + 0xaf8))(0,0x1004,local_48);
    local_52 = CheckErrorAndLog(this,"glGetTextureParameterIuiv",0x1004);
    local_53 = CompareAndLog(this,(GLuint *)&local_98,(GLuint *)local_48,0x1004);
    local_98 = local_98 & 0xffffffff00000000;
    (**(code **)(lVar8 + 0x1428))(0,0x884d,0x203);
    local_54 = CheckErrorAndLog(this,"glTextureParameteri",0x884d);
    (**(code **)(lVar8 + 0xb08))(0,0x884d,&local_98);
    local_55 = CheckErrorAndLog(this,"glGetTextureParameteriv",0x884d);
    local_56 = CompareAndLog(this,0x203,(GLint)(GLfloat)local_98,0x884d);
    local_98 = local_98 & 0xffffffff00000000;
    (**(code **)(lVar8 + 0x1428))(0,0x884c,0x884e);
    local_57 = CheckErrorAndLog(this,"glTextureParameteri",0x884c);
    (**(code **)(lVar8 + 0xb08))(0,0x884c,&local_98);
    local_58 = CheckErrorAndLog(this,"glGetTextureParameteriv",0x884c);
    local_59 = CompareAndLog(this,0x884e,(GLint)(GLfloat)local_98,0x884c);
    local_98 = local_98 & 0xffffffff00000000;
    (**(code **)(lVar8 + 0x1418))(0xc0000000,0,0x8501);
    local_5a = CheckErrorAndLog(this,"glTextureParameterf",0x8501);
    (**(code **)(lVar8 + 0xb00))(0,0x8501,&local_98);
    local_5b = CheckErrorAndLog(this,"glGetTextureParameterfv",0x8501);
    local_5c = CompareAndLog(this,-2.0,(GLfloat)local_98,0x8501);
    local_98 = local_98 & 0xffffffff00000000;
    (**(code **)(lVar8 + 0x1428))(0,0x2801,0x2701);
    local_5d = CheckErrorAndLog(this,"glTextureParameteri",0x2801);
    (**(code **)(lVar8 + 0xb08))(0,0x2801,&local_98);
    local_5e = CheckErrorAndLog(this,"glGetTextureParameteriv",0x2801);
    local_5f = CompareAndLog(this,0x2701,(GLint)(GLfloat)local_98,0x2801);
    local_98 = local_98 & 0xffffffff00000000;
    (**(code **)(lVar8 + 0x1428))(0,0x2800,0x2600);
    local_60 = CheckErrorAndLog(this,"glTextureParameteri",0x2800);
    (**(code **)(lVar8 + 0xb08))(0,0x2800,&local_98);
    local_61 = CheckErrorAndLog(this,"glGetTextureParameteriv",0x2800);
    local_62 = CompareAndLog(this,0x2600,(GLint)(GLfloat)local_98,0x2800);
    local_98 = local_98 & 0xffffffff00000000;
    (**(code **)(lVar8 + 0x1428))(0,0x813a,0xffffff9c);
    local_63 = CheckErrorAndLog(this,"glTextureParameteri",0x813a);
    (**(code **)(lVar8 + 0xb08))(0,0x813a,&local_98);
    local_64 = CheckErrorAndLog(this,"glGetTextureParameteriv",0x813a);
    local_65 = CompareAndLog(this,-100,(GLint)(GLfloat)local_98,0x813a);
    local_98 = local_98 & 0xffffffff00000000;
    (**(code **)(lVar8 + 0x1428))(0,0x813b,100);
    local_66 = CheckErrorAndLog(this,"glTextureParameteri",0x813b);
    (**(code **)(lVar8 + 0xb08))(0,0x813b,&local_98);
    local_67 = CheckErrorAndLog(this,"glGetTextureParameteriv",0x813b);
    local_68 = CompareAndLog(this,100,(GLint)(GLfloat)local_98,0x813b);
    local_98 = local_98 & 0xffffffff00000000;
    (**(code **)(lVar8 + 0x1428))(0,0x813d,100);
    local_69 = CheckErrorAndLog(this,"glTextureParameteri",0x813d);
    (**(code **)(lVar8 + 0xb08))(0,0x813d,&local_98);
    local_6a = CheckErrorAndLog(this,"glGetTextureParameteriv",0x813d);
    local_6b = CompareAndLog(this,100,(GLint)(GLfloat)local_98,0x813d);
    local_98 = local_98 & 0xffffffff00000000;
    (**(code **)(lVar8 + 0x1428))(0,0x8e42,0x1905);
    local_6c = CheckErrorAndLog(this,"glTextureParameteri",0x8e42);
    (**(code **)(lVar8 + 0xb08))(0,0x8e42,&local_98);
    local_6d = CheckErrorAndLog(this,"glGetTextureParameteriv",0x8e42);
    local_6e = CompareAndLog(this,0x1905,(GLint)(GLfloat)local_98,0x8e42);
    local_98 = local_98 & 0xffffffff00000000;
    (**(code **)(lVar8 + 0x1428))(0,0x8e43,0x1906);
    local_6f = CheckErrorAndLog(this,"glTextureParameteri",0x8e43);
    (**(code **)(lVar8 + 0xb08))(0,0x8e43,&local_98);
    local_70 = CheckErrorAndLog(this,"glGetTextureParameteriv",0x8e43);
    local_71 = CompareAndLog(this,0x1906,(GLint)(GLfloat)local_98,0x8e43);
    local_98 = local_98 & 0xffffffff00000000;
    (**(code **)(lVar8 + 0x1428))(0,0x8e44,0x1903);
    local_72 = CheckErrorAndLog(this,"glTextureParameteri",0x8e44);
    (**(code **)(lVar8 + 0xb08))(0,0x8e44,&local_98);
    local_73 = CheckErrorAndLog(this,"glGetTextureParameteriv",0x8e44);
    local_74 = CompareAndLog(this,0x1903,(GLint)(GLfloat)local_98,0x8e44);
    local_98 = local_98 & 0xffffffff00000000;
    (**(code **)(lVar8 + 0x1428))(0,0x8e45,0x1904);
    local_75 = CheckErrorAndLog(this,"glTextureParameteri",0x8e45);
    (**(code **)(lVar8 + 0xb08))(0,0x8e45,&local_98);
    local_76 = CheckErrorAndLog(this,"glGetTextureParameteriv",0x8e45);
    local_77 = CompareAndLog(this,0x1904,(GLint)(GLfloat)local_98,0x8e45);
    local_98 = 0x100000000;
    uStack_90 = 0x100000000;
    local_48[0] = 0.0;
    local_48[1] = 0.0;
    local_48[2] = 0.0;
    local_48[3] = 0.0;
    (**(code **)(lVar8 + 0x1430))(0,0x8e46);
    local_78 = CheckErrorAndLog(this,"glTextureParameteri",0x8e46);
    (**(code **)(lVar8 + 0xb08))(0,0x8e46,local_48);
    local_79 = CheckErrorAndLog(this,"glGetTextureParameteriv",0x8e46);
    local_7a = CompareAndLog(this,(GLint *)&local_98,(GLint *)local_48,0x8e46);
    local_98._0_4_ = 1.54143e-44;
    (**(code **)(lVar8 + 0x1428))(0,0x2802,0x8743);
    local_7b = CheckErrorAndLog(this,"glTextureParameteri",0x2802);
    (**(code **)(lVar8 + 0xb08))(0,0x2802,&local_98);
    local_7c = CheckErrorAndLog(this,"glGetTextureParameteriv",0x2802);
    local_7d = CompareAndLog(this,0x8743,(GLint)(GLfloat)local_98,0x2802);
    local_98._0_4_ = 1.54143e-44;
    (**(code **)(lVar8 + 0x1428))(0,0x2803,0x812f);
    local_7e = CheckErrorAndLog(this,"glTextureParameteri",0x2803);
    (**(code **)(lVar8 + 0xb08))(0,0x2803,&local_98);
    local_7f = CheckErrorAndLog(this,"glGetTextureParameteriv",0x2803);
    local_80 = CompareAndLog(this,0x812f,(GLint)(GLfloat)local_98,0x2803);
    local_98 = CONCAT44(local_98._4_4_,0x812f);
    local_48[0] = 1.54143e-44;
    (**(code **)(lVar8 + 0x1430))(0,0x8072);
    local_81 = CheckErrorAndLog(this,"glTextureParameteri",0x8072);
    (**(code **)(lVar8 + 0xb08))(0,0x8072,local_48);
    local_82 = CheckErrorAndLog(this,"glGetTextureParameteriv",0x8072);
    bVar5 = CompareAndLog(this,(GLint)(GLfloat)local_98,(GLint)local_48[0],0x8072);
    bVar9 = (((bVar1 && bVar2) && bVar3) && bVar4) & local_49 & local_4a & local_4b & local_4c &
            local_4d & local_4e & local_4f & local_50 & local_51 & local_52 & local_53 & local_54 &
            local_55 & local_56 & local_57 & local_58 & local_59 & local_5a & local_5b & local_5c &
            local_5d & local_5e & local_5f & local_60 & local_61 & local_62 & local_63 & local_64 &
            local_65 & local_66 & local_67 & local_68 & local_69 & local_6a & local_6b & local_6c &
            local_6d & local_6e & local_6f & local_70 & local_71 & local_72 & local_73 & local_74 &
            local_75 & local_76 & local_77 & local_78 & local_79 & local_7a & local_7b & local_7c &
            local_7d & local_7e & local_7f & local_80 & local_81 & local_82;
    do {
      iVar6 = (**(code **)(lVar8 + 0x800))();
    } while (iVar6 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if ((bVar9 & bVar5) == 0) {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    else {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetSetParameterTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Texture. */
	glw::GLuint texture = 0;

	try
	{
		gl.genTextures(1, &texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		gl.bindTexture(GL_TEXTURE_3D, texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

		{
			glw::GLenum name	  = GL_DEPTH_STENCIL_TEXTURE_MODE;
			glw::GLint  value_src = GL_DEPTH_COMPONENT;
			glw::GLint  value_dst = 0;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_BASE_LEVEL;
			glw::GLint  value_src = 2;
			glw::GLint  value_dst = 0;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum  name		  = GL_TEXTURE_BORDER_COLOR;
			glw::GLfloat value_src[4] = { 0.25, 0.5, 0.75, 1.0 };
			glw::GLfloat value_dst[4] = {};

			gl.textureParameterfv(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameterfv", name);

			gl.getTextureParameterfv(texture, name, value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameterfv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name		 = GL_TEXTURE_BORDER_COLOR;
			glw::GLint  value_src[4] = { 0, 64, -64, -32 };
			glw::GLint  value_dst[4] = {};

			gl.textureParameterIiv(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameterIiv", name);

			gl.getTextureParameterIiv(texture, name, value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameterIiv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name		 = GL_TEXTURE_BORDER_COLOR;
			glw::GLuint value_src[4] = { 0, 64, 128, 192 };
			glw::GLuint value_dst[4] = {};

			gl.textureParameterIuiv(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameterIuiv", name);

			gl.getTextureParameterIuiv(texture, name, value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameterIuiv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_COMPARE_FUNC;
			glw::GLint  value_src = GL_LEQUAL;
			glw::GLint  value_dst = 0;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_COMPARE_MODE;
			glw::GLint  value_src = GL_COMPARE_REF_TO_TEXTURE;
			glw::GLint  value_dst = 0;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum  name	  = GL_TEXTURE_LOD_BIAS;
			glw::GLfloat value_src = -2.f;
			glw::GLfloat value_dst = 0.f;

			gl.textureParameterf(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameterf", name);

			gl.getTextureParameterfv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameterfv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_MIN_FILTER;
			glw::GLint  value_src = GL_LINEAR_MIPMAP_NEAREST;
			glw::GLint  value_dst = 0;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_MAG_FILTER;
			glw::GLint  value_src = GL_NEAREST;
			glw::GLint  value_dst = 0;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_MIN_LOD;
			glw::GLint  value_src = -100;
			glw::GLint  value_dst = 0;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_MAX_LOD;
			glw::GLint  value_src = 100;
			glw::GLint  value_dst = 0;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_MAX_LEVEL;
			glw::GLint  value_src = 100;
			glw::GLint  value_dst = 0;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_SWIZZLE_R;
			glw::GLint  value_src = GL_BLUE;
			glw::GLint  value_dst = 0;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_SWIZZLE_G;
			glw::GLint  value_src = GL_ALPHA;
			glw::GLint  value_dst = 0;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_SWIZZLE_B;
			glw::GLint  value_src = GL_RED;
			glw::GLint  value_dst = 0;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_SWIZZLE_A;
			glw::GLint  value_src = GL_GREEN;
			glw::GLint  value_dst = 0;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name		 = GL_TEXTURE_SWIZZLE_RGBA;
			glw::GLint  value_src[4] = { GL_ZERO, GL_ONE, GL_ZERO, GL_ONE };
			glw::GLint  value_dst[4] = {};

			gl.textureParameteriv(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_WRAP_S;
			glw::GLint  value_src = GL_MIRROR_CLAMP_TO_EDGE;
			glw::GLint  value_dst = 11;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_WRAP_T;
			glw::GLint  value_src = GL_CLAMP_TO_EDGE;
			glw::GLint  value_dst = 11;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_WRAP_R;
			glw::GLint  value_src = GL_CLAMP_TO_EDGE;
			glw::GLint  value_dst = 11;

			gl.textureParameteriv(texture, name, &value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (texture)
	{
		gl.deleteTextures(1, &texture);
	}

	while (GL_NO_ERROR != gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}